

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall Catch::Session::runInternal(Session *this)

{
  _Rb_tree_header *p_Var1;
  set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  *this_00;
  ColourMode CVar2;
  undefined8 *puVar3;
  Config *pCVar4;
  pointer config;
  size_t sVar5;
  unique_ptr<Catch::MultiReporter> uVar6;
  undefined8 uVar7;
  uint64_t uVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar13;
  undefined4 extraout_var;
  undefined8 *puVar14;
  ostream *poVar15;
  Context *pCVar16;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases;
  TestSpec *this_01;
  _Base_ptr p_Var17;
  long lVar18;
  TestCaseInfo **testInfo;
  pointer pFVar19;
  size_t in_R8;
  MultiReporter *temp;
  const_iterator __begin3;
  ReporterConfig *config_00;
  pointer pFVar20;
  unique_ptr<Catch::MultiReporter> multi;
  IEventListenerPtr reporter;
  IEventListener *local_2f8;
  undefined1 local_2f0 [16];
  ReporterConfig *local_2e0;
  Totals totals;
  undefined1 local_298 [64];
  TestGroup tests;
  undefined4 extraout_var_03;
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  if ((this->m_configData).shardCount <= (this->m_configData).shardIndex) {
    poVar15 = std::operator<<((ostream *)&std::cerr,"The shard count (");
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    poVar15 = std::operator<<(poVar15,") must be greater than the shard index (");
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    std::operator<<(poVar15,")\n");
    std::ostream::flush();
    return 1;
  }
  Session::config(this);
  seedRng(&((this->m_config).m_ptr)->super_IConfig);
  if ((this->m_configData).filenamesAsTags == true) {
    pSVar13 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar10 = (*(pSVar13->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar13);
    puVar14 = (undefined8 *)
              (**(code **)(*(long *)CONCAT44(extraout_var,iVar10) + 0x10))
                        ((long *)CONCAT44(extraout_var,iVar10));
    puVar3 = (undefined8 *)puVar14[1];
    for (puVar14 = (undefined8 *)*puVar14; puVar14 != puVar3; puVar14 = puVar14 + 1) {
      TestCaseInfo::addFilenameTag((TestCaseInfo *)*puVar14);
    }
  }
  pCVar16 = getCurrentMutableContext();
  pCVar4 = (this->m_config).m_ptr;
  pCVar16->m_config = &pCVar4->super_IConfig;
  totals.assertions.passed = (uint64_t)pCVar4;
  pSVar13 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar10 = (*(pSVar13->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar13);
  local_2f0._0_8_ = this;
  if ((**(long **)CONCAT44(extraout_var_00,iVar10) ==
       (*(long **)CONCAT44(extraout_var_00,iVar10))[1]) &&
     (config = (pCVar4->m_processedReporterSpecs).
               super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(pCVar4->m_processedReporterSpecs).
           super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish - (long)config == 0x78)) {
    makeStream((Catch *)&multi,(string *)&config->outputFilename);
    CVar2 = config->colourMode;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_298,&(config->customOptions)._M_t);
    tests.m_reporter = &(multi.m_ptr)->super_IEventListener;
    tests.m_config = pCVar4;
    tests.m_context.super_IResultCapture._vptr_IResultCapture._0_1_ = CVar2;
    std::_Rb_tree_header::_Rb_tree_header
              ((_Rb_tree_header *)&tests.m_context.m_runInfo.name.m_size,
               (_Rb_tree_header *)(local_298 + 8));
    anon_unknown_26::createReporter((string *)&reporter,(ReporterConfig *)config);
    ReporterConfig::~ReporterConfig((ReporterConfig *)&tests);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_298);
  }
  else {
    Detail::make_unique<Catch::MultiReporter,Catch::Config_const*&>
              ((Detail *)&multi,(Config **)&totals);
    pSVar13 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar10 = (*(pSVar13->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar13);
    puVar3 = (undefined8 *)(*(undefined8 **)CONCAT44(extraout_var_01,iVar10))[1];
    for (puVar14 = (undefined8 *)**(undefined8 **)CONCAT44(extraout_var_01,iVar10);
        uVar6.m_ptr = multi.m_ptr, puVar14 != puVar3; puVar14 = puVar14 + 1) {
      (**(code **)(*(long *)*puVar14 + 0x10))(&tests,(long *)*puVar14,totals.assertions.passed);
      MultiReporter::addListener(uVar6.m_ptr,(IEventListenerPtr *)&tests);
      if (tests.m_reporter != (IEventListener *)0x0) {
        (*(tests.m_reporter)->_vptr_IEventListener[1])();
      }
    }
    local_2e0 = *(ReporterConfig **)(totals.assertions.passed + 0x120);
    for (config_00 = *(ReporterConfig **)(totals.assertions.passed + 0x118);
        uVar8 = totals.assertions.passed, uVar6.m_ptr = multi.m_ptr, config_00 != local_2e0;
        config_00 = (ReporterConfig *)
                    &config_00[1].m_customOptions._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left) {
      makeStream((Catch *)&local_2f8,
                 (string *)&(config_00->m_customOptions)._M_t._M_impl.super__Rb_tree_header);
      sVar5 = (config_00->m_customOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_298,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(config_00 + 1));
      tests.m_reporter = local_2f8;
      local_2f8 = (IEventListener *)0x0;
      tests.m_config = (Config *)uVar8;
      tests.m_context.super_IResultCapture._vptr_IResultCapture._0_1_ = (ColourMode)sVar5;
      std::_Rb_tree_header::_Rb_tree_header
                ((_Rb_tree_header *)&tests.m_context.m_runInfo.name.m_size,
                 (_Rb_tree_header *)(local_298 + 8));
      anon_unknown_26::createReporter((string *)(local_2f0 + 8),config_00);
      MultiReporter::addReporter(uVar6.m_ptr,(IEventListenerPtr *)(local_2f0 + 8));
      if ((long *)local_2f0._8_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_2f0._8_8_ + 8))();
      }
      ReporterConfig::~ReporterConfig((ReporterConfig *)&tests);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_298);
    }
    multi.m_ptr = (MultiReporter *)0x0;
    reporter.m_ptr = &(uVar6.m_ptr)->super_IEventListener;
    Detail::unique_ptr<Catch::MultiReporter>::~unique_ptr(&multi);
    this = (Session *)local_2f0._0_8_;
  }
  iVar10 = (*(((this->m_config).m_ptr)->super_IConfig)._vptr_IConfig[0xd])();
  puVar14 = *(undefined8 **)(CONCAT44(extraout_var_02,iVar10) + 0x18);
  puVar3 = *(undefined8 **)(CONCAT44(extraout_var_02,iVar10) + 0x20);
  if (puVar14 != puVar3) {
    iVar10 = 1;
    for (; puVar14 != puVar3; puVar14 = puVar14 + 4) {
      (*(reporter.m_ptr)->_vptr_IEventListener[3])(reporter.m_ptr,*puVar14,puVar14[1]);
    }
    goto LAB_001360b7;
  }
  bVar9 = list(reporter.m_ptr,(this->m_config).m_ptr);
  iVar10 = 0;
  if (bVar9) goto LAB_001360b7;
  tests.m_config = (this->m_config).m_ptr;
  tests.m_reporter = reporter.m_ptr;
  RunContext::RunContext(&tests.m_context,&(tests.m_config)->super_IConfig,&reporter);
  p_Var1 = &tests.m_tests._M_t._M_impl.super__Rb_tree_header;
  tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  this_00 = &tests.m_tests;
  tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tests.m_matches.
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tests.m_matches.
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tests.m_matches.
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests.m_unmatchedTestSpecs = false;
  tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testCases = getAllTestCasesSorted(&(tests.m_config)->super_IConfig);
  iVar10 = (*((tests.m_config)->super_IConfig)._vptr_IConfig[0xd])();
  this_01 = (TestSpec *)CONCAT44(extraout_var_03,iVar10);
  if ((this_01->m_filters).
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this_01->m_filters).
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar19 = (pointer)(testCases->
                       super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
    for (pFVar20 = (pointer)(testCases->
                            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                            )._M_impl.super__Vector_impl_data._M_start; pFVar20 != pFVar19;
        pFVar20 = (pointer)&(pFVar20->name).field_2) {
      if ((((TestCaseInfo *)(pFVar20->name)._M_dataplus._M_p)->properties & IsHidden) == None) {
        local_298._0_8_ = pFVar20;
        std::
        _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
        ::_M_emplace_unique<Catch::TestCaseHandle_const*>
                  ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                    *)this_00,(TestCaseHandle **)local_298);
      }
    }
  }
  else {
    TestSpec::matchesByFilter
              ((Matches *)local_298,this_01,testCases,&(tests.m_config)->super_IConfig);
    std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
    _M_move_assign(&tests.m_matches,
                   (vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                    *)local_298);
    std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
    ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
            local_298);
    pFVar20 = tests.m_matches.
              super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pFVar19 = tests.m_matches.
                   super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar19 != pFVar20;
        pFVar19 = pFVar19 + 1) {
      std::
      _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle_const*const*,std::vector<Catch::TestCaseHandle_const*,std::allocator<Catch::TestCaseHandle_const*>>>>
                ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                  *)this_00,
                 (__normal_iterator<const_Catch::TestCaseHandle_*const_*,_std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>_>
                  )(pFVar19->tests).
                   super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_Catch::TestCaseHandle_*const_*,_std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>_>
                  )(pFVar19->tests).
                   super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  uVar11 = (*((tests.m_config)->super_IConfig)._vptr_IConfig[0x12])();
  uVar12 = (*((tests.m_config)->super_IConfig)._vptr_IConfig[0x13])();
  createShard<std::set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>>
            ((set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
              *)local_298,(Catch *)this_00,
             (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
              *)(ulong)uVar11,(ulong)uVar12,in_R8);
  std::
  _Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  ::operator=(&this_00->_M_t,
              (_Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
               *)local_298);
  std::
  _Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  ::~_Rb_tree((_Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
               *)local_298);
  totals.testCases.failedButOk = 0;
  totals.testCases.skipped = 0;
  totals.testCases.passed = 0;
  totals.testCases.failed = 0;
  totals.assertions.failedButOk = 0;
  totals.assertions.skipped = 0;
  totals.assertions.passed = 0;
  totals.assertions.failed = 0;
  for (p_Var17 = tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pFVar20 = tests.m_matches.
                super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      uVar8 = tests.m_context.m_totals.assertions.failed, uVar7 = local_2f0._0_8_,
      pFVar19 = tests.m_matches.
                super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                ._M_impl.super__Vector_impl_data._M_start, (_Rb_tree_header *)p_Var17 != p_Var1;
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
    iVar10 = (*(tests.m_context.m_config)->_vptr_IConfig[9])();
    if (uVar8 < (ulong)(long)iVar10) {
      RunContext::runTest((Totals *)local_298,&tests.m_context,*(TestCaseHandle **)(p_Var17 + 1));
      Totals::operator+=(&totals,(Totals *)local_298);
    }
    else {
      (*(tests.m_reporter)->_vptr_IEventListener[0x12])
                (tests.m_reporter,**(undefined8 **)(p_Var17 + 1));
    }
  }
  for (; pFVar19 != pFVar20; pFVar19 = pFVar19 + 1) {
    if ((pFVar19->tests).
        super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pFVar19->tests).
        super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      tests.m_unmatchedTestSpecs = true;
      (*(tests.m_reporter)->_vptr_IEventListener[2])
                (tests.m_reporter,(pFVar19->name)._M_dataplus._M_p,(pFVar19->name)._M_string_length)
      ;
    }
  }
  if ((tests.m_unmatchedTestSpecs == true) &&
     (iVar10 = (*(((unique_ptr<Catch::Config> *)(uVar7 + 0x170))->m_ptr->super_IConfig).
                 _vptr_IConfig[7])(), (char)iVar10 != '\0')) {
    iVar10 = 3;
  }
  else {
    lVar18 = totals.testCases.failed + totals.testCases.passed;
    if (lVar18 + totals.testCases.failedButOk + totals.testCases.skipped == 0) {
      iVar10 = (*(((unique_ptr<Catch::Config> *)(uVar7 + 0x170))->m_ptr->super_IConfig).
                 _vptr_IConfig[8])();
      if ((char)iVar10 == '\0') {
        iVar10 = 2;
        goto LAB_001360aa;
      }
      lVar18 = totals.testCases.failed + totals.testCases.passed;
    }
    if (((lVar18 + totals.testCases.failedButOk == 0) && (totals.testCases.skipped != 0)) &&
       (iVar10 = (*(((unique_ptr<Catch::Config> *)(uVar7 + 0x170))->m_ptr->super_IConfig).
                   _vptr_IConfig[8])(), (char)iVar10 == '\0')) {
      iVar10 = 4;
    }
    else {
      iVar10 = 0xff;
      if ((int)totals.assertions.failed < 0xff) {
        iVar10 = (int)totals.assertions.failed;
      }
    }
  }
LAB_001360aa:
  anon_unknown_26::TestGroup::~TestGroup(&tests);
LAB_001360b7:
  if (reporter.m_ptr != (IEventListener *)0x0) {
    (*(reporter.m_ptr)->_vptr_IEventListener[1])();
    return iVar10;
  }
  return iVar10;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        if ( m_configData.shardIndex >= m_configData.shardCount ) {
            Catch::cerr() << "The shard count (" << m_configData.shardCount
                          << ") must be greater than the shard index ("
                          << m_configData.shardIndex << ")\n"
                          << std::flush;
            return 1;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if (m_configData.filenamesAsTags) {
                applyFilenamesAsTags();
            }

            // Set up global config instance before we start calling into other functions
            getCurrentMutableContext().setConfig(m_config.get());

            // Create reporter(s) so we can route listings through them
            auto reporter = prepareReporters(m_config.get());

            auto const& invalidSpecs = m_config->testSpec().getInvalidSpecs();
            if ( !invalidSpecs.empty() ) {
                for ( auto const& spec : invalidSpecs ) {
                    reporter->reportInvalidTestSpec( spec );
                }
                return 1;
            }


            // Handle list request
            if (list(*reporter, *m_config)) {
                return 0;
            }

            TestGroup tests { CATCH_MOVE(reporter), m_config.get() };
            auto const totals = tests.execute();

            if ( tests.hadUnmatchedTestSpecs()
                && m_config->warnAboutUnmatchedTestSpecs() ) {
                return 3;
            }

            if ( totals.testCases.total() == 0
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 2;
            }

            if ( totals.testCases.total() > 0 &&
                 totals.testCases.total() == totals.testCases.skipped
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 4;
            }

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, static_cast<int>(totals.assertions.failed));
        }